

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O3

string * __thiscall
cmUuid::BinaryToString_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar *input)

{
  array<int,_5UL> *paVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  lVar4 = 0;
  do {
    paVar1 = &kUuidGroups;
    if (lVar3 != 0) {
      this = (cmUuid *)0x2d;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      paVar1 = (array<int,_5UL> *)(kUuidGroups._M_elems + lVar3);
    }
    lVar2 = (long)paVar1->_M_elems[0];
    lVar5 = lVar4;
    if (lVar2 != 0) {
      lVar5 = lVar4 + lVar2;
      lVar6 = 0;
      do {
        ByteToHex_abi_cxx11_(&local_50,this,input[lVar6 + lVar4]);
        this = (cmUuid *)local_50._M_dataplus._M_p;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          this = (cmUuid *)(local_50.field_2._M_allocated_capacity + 1);
          operator_delete(local_50._M_dataplus._M_p,(ulong)this);
        }
        lVar6 = lVar6 + 1;
      } while (lVar2 != lVar6);
    }
    lVar3 = lVar3 + 1;
    lVar4 = lVar5;
  } while (lVar3 != 5);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::BinaryToString(const unsigned char* input) const
{
  std::string output;

  size_t inputIndex = 0;
  for (size_t i = 0; i < kUuidGroups.size(); ++i) {
    if (i != 0) {
      output += '-';
    }

    size_t bytes = kUuidGroups[i];
    for (size_t j = 0; j < bytes; ++j) {
      unsigned char byte = input[inputIndex++];
      output += this->ByteToHex(byte);
    }
  }

  return output;
}